

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O1

void __thiscall
Bezier<3,_2>::Bezier
          (Bezier<3,_2> *this,initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *list)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  iterator pMVar4;
  double dVar5;
  undefined8 uVar6;
  long lVar7;
  bool bVar8;
  double dStack_28;
  double dStack_20;
  double dStack_18;
  anon_class_8_1_8991fb9c aStack_10;
  
  (this->super_Curve<3,_2>).length_ = -1.0;
  (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)&PTR_computeLength_0010b9e8;
  sVar3 = list->_M_len;
  if (sVar3 != 0) {
    pMVar4 = list->_M_array;
    lVar7 = 0;
    while( true ) {
      puVar1 = (undefined8 *)
               ((long)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                      m_storage.m_data.array + lVar7);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)this->derivative_precal_points_[0].
                      super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.
                      array + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      if (lVar7 == 0x30) break;
      bVar8 = sVar3 * 0x10 + -0x10 == lVar7;
      lVar7 = lVar7 + 0x10;
      if (bVar8) {
        computeLength(this);
        return;
      }
    }
  }
  derivativePrecompute(this);
  dStack_18 = 0.0;
  dStack_20 = 1.0;
  dStack_28 = 0.0001;
  aStack_10.this = &this->super_Curve<3,_2>;
  dVar5 = NumericalQuadrature::
          adaptive_simpson_3_8<Curve<3,2>::computeLength()::_lambda(double)_1_&>
                    (&aStack_10,&dStack_18,&dStack_20,&dStack_28);
  (this->super_Curve<3,_2>).length_ = dVar5;
  return;
}

Assistant:

Bezier(const std::initializer_list<PointType>& list) { set(std::forward<decltype(list)>(list)); }